

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O1

void kboxinit(gost_ctx *c,gost_subst_block *b)

{
  int i;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1 >> 4 & 0xfffffff;
    uVar3 = (uint)uVar1 & 0xf;
    c->k87[uVar1] = (uint)b->k7[uVar3] << 0x18 | (uint)b->k8[uVar2] << 0x1c;
    c->k65[uVar1] = (uint)b->k5[uVar3] << 0x10 | (uint)b->k6[uVar2] << 0x14;
    c->k43[uVar1] = (uint)b->k3[uVar3] << 8 | (uint)b->k4[uVar2] << 0xc;
    c->k21[uVar1] = (uint)b->k1[uVar3] | (uint)b->k2[uVar2] << 4;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x100);
  return;
}

Assistant:

void kboxinit(gost_ctx * c, const gost_subst_block * b)
{
    int i;

    for (i = 0; i < 256; i++) {
        c->k87[i] = (word32) (b->k8[i >> 4] << 4 | b->k7[i & 15]) << 24;
        c->k65[i] = (b->k6[i >> 4] << 4 | b->k5[i & 15]) << 16;
        c->k43[i] = (b->k4[i >> 4] << 4 | b->k3[i & 15]) << 8;
        c->k21[i] = b->k2[i >> 4] << 4 | b->k1[i & 15];

    }
}